

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_itrans_recon_8x8.c
# Opt level: O3

void ihevc_itrans_recon_8x8
               (WORD16 *pi2_src,WORD16 *pi2_tmp,UWORD8 *pu1_pred,UWORD8 *pu1_dst,WORD32 src_strd,
               WORD32 pred_strd,WORD32 dst_strd,WORD32 zero_cols,WORD32 zero_rows)

{
  int iVar1;
  long lVar2;
  undefined1 (*pauVar3) [16];
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  undefined1 in_XMM0 [16];
  undefined1 auVar15 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar16 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int local_b8 [12];
  undefined1 auStack_88 [8];
  WORD32 e [4];
  WORD32 o [4];
  
  uVar9 = zero_cols & 0xf0;
  iVar11 = (uint)(uVar9 != 0xf0) * 4 + 4;
  if ((~zero_rows & 0xf0U) == 0) {
    auVar15 = pmovsxwd(in_XMM0,0x120032004b0059);
    auVar16 = pmovsxwd(in_XMM1,0xffceffa7ffee004b);
    lVar2 = 0;
    auVar20 = pmovsxbd(in_XMM3,0x40404040);
    pauVar3 = (undefined1 (*) [16])pi2_tmp;
    do {
      if ((zero_cols & 1U) == 0) {
        iVar13 = (int)pi2_src[src_strd * 3 + lVar2];
        iVar6 = (int)pi2_src[src_strd + lVar2];
        auVar23._4_4_ = iVar6;
        auVar23._0_4_ = iVar6;
        auVar23._8_4_ = iVar6;
        auVar23._12_4_ = iVar6;
        auVar17._4_4_ = iVar13;
        auVar17._0_4_ = iVar13;
        auVar17._8_4_ = iVar13;
        auVar17._12_4_ = iVar13;
        auVar24 = pmulld(auVar23,auVar15);
        auVar18 = pmulld(auVar17,auVar16);
        auStack_88._0_4_ = auVar18._0_4_ + auVar24._0_4_;
        auStack_88._4_4_ = auVar18._4_4_ + auVar24._4_4_;
        e[0] = auVar18._8_4_ + auVar24._8_4_;
        e[1] = auVar18._12_4_ + auVar24._12_4_;
        iVar7 = (int)pi2_src[src_strd * 2 + lVar2];
        iVar1 = pi2_src[lVar2] * 0x40;
        iVar10 = pi2_src[lVar2] * 0x40;
        iVar6 = iVar10 + iVar7 * 0x53;
        iVar10 = iVar10 + iVar7 * -0x53;
        iVar13 = iVar1 + iVar7 * 0x24;
        iVar1 = iVar1 + iVar7 * -0x24;
        auVar25._0_4_ = iVar6 + auStack_88._0_4_ + auVar20._0_4_ >> 7;
        auVar25._4_4_ = iVar13 + auStack_88._4_4_ + auVar20._4_4_ >> 7;
        auVar25._8_4_ = iVar1 + e[0] + auVar20._8_4_ >> 7;
        auVar25._12_4_ = iVar10 + e[1] + auVar20._12_4_ >> 7;
        auVar18 = packssdw(auVar25,auVar25);
        *(long *)*pauVar3 = auVar18._0_8_;
        auVar26._0_4_ = (iVar10 - e[1]) + auVar20._0_4_ >> 7;
        auVar26._4_4_ = (iVar1 - e[0]) + auVar20._4_4_ >> 7;
        auVar26._8_4_ = (iVar13 - auStack_88._4_4_) + auVar20._8_4_ >> 7;
        auVar26._12_4_ = (iVar6 - auStack_88._0_4_) + auVar20._12_4_ >> 7;
        auVar18 = packssdw(auVar26,auVar26);
        *(long *)(*pauVar3 + 8) = auVar18._0_8_;
      }
      else {
        *pauVar3 = (undefined1  [16])0x0;
      }
      pauVar3 = pauVar3 + 1;
      zero_cols = zero_cols >> 1;
      lVar2 = lVar2 + 1;
    } while (iVar11 != (int)lVar2);
    if (uVar9 == 0xf0) {
      iVar11 = 0;
      do {
        iVar6 = (int)pi2_tmp[0x18];
        iVar13 = (int)pi2_tmp[8];
        auVar19._4_4_ = iVar13;
        auVar19._0_4_ = iVar13;
        auVar19._8_4_ = iVar13;
        auVar19._12_4_ = iVar13;
        auVar21._4_4_ = iVar6;
        auVar21._0_4_ = iVar6;
        auVar21._8_4_ = iVar6;
        auVar21._12_4_ = iVar6;
        auVar20 = pmulld(auVar19,auVar15);
        auVar18 = pmulld(auVar21,auVar16);
        auStack_88._4_4_ = auVar18._4_4_ + auVar20._4_4_;
        auStack_88._0_4_ = auVar18._0_4_ + auVar20._0_4_;
        e[0] = auVar18._8_4_ + auVar20._8_4_;
        e[1] = auVar18._12_4_ + auVar20._12_4_;
        iVar6 = (int)pi2_tmp[0x10];
        iVar1 = *pi2_tmp * 0x40;
        iVar13 = *pi2_tmp * 0x40;
        local_b8[0] = iVar13 + iVar6 * 0x53;
        local_b8[3] = iVar13 + iVar6 * -0x53;
        local_b8[1] = iVar1 + iVar6 * 0x24;
        local_b8[2] = iVar1 + iVar6 * -0x24;
        lVar14 = 0xc;
        lVar2 = 0;
        do {
          iVar6 = local_b8[lVar2] + e[lVar2 + -2] + 0x800 >> 0xc;
          if (iVar6 < -0x7fff) {
            iVar6 = -0x8000;
          }
          if (0x7ffe < iVar6) {
            iVar6 = 0x7fff;
          }
          iVar6 = (uint)pu1_pred[lVar2] + iVar6;
          if (iVar6 < 1) {
            iVar6 = 0;
          }
          if (0xfe < iVar6) {
            iVar6 = 0xff;
          }
          pu1_dst[lVar2] = (UWORD8)iVar6;
          iVar6 = (*(int *)((long)local_b8 + lVar14) - *(int *)(auStack_88 + lVar14)) + 0x800 >> 0xc
          ;
          if (iVar6 < -0x7fff) {
            iVar6 = -0x8000;
          }
          if (0x7ffe < iVar6) {
            iVar6 = 0x7fff;
          }
          iVar6 = (uint)pu1_pred[lVar2 + 4] + iVar6;
          if (iVar6 < 1) {
            iVar6 = 0;
          }
          if (0xfe < iVar6) {
            iVar6 = 0xff;
          }
          pu1_dst[lVar2 + 4] = (UWORD8)iVar6;
          lVar2 = lVar2 + 1;
          lVar14 = lVar14 + -4;
        } while (lVar2 != 4);
        pi2_tmp = pi2_tmp + 1;
        pu1_pred = pu1_pred + pred_strd;
        pu1_dst = pu1_dst + dst_strd;
        iVar11 = iVar11 + 1;
      } while (iVar11 != 8);
    }
    else {
      auVar18 = pmovsxwd(_auStack_88,0x4b0012ffa70032);
      auVar20 = pmovsxwd(auVar20,0xffa7004bffce0012);
      iVar11 = 0;
      do {
        iVar6 = (int)pi2_tmp[0x38];
        iVar13 = (int)pi2_tmp[0x28];
        iVar1 = (int)pi2_tmp[0x18];
        iVar7 = (int)pi2_tmp[8];
        auVar22._4_4_ = iVar7;
        auVar22._0_4_ = iVar7;
        auVar22._8_4_ = iVar7;
        auVar22._12_4_ = iVar7;
        auVar27._4_4_ = iVar1;
        auVar27._0_4_ = iVar1;
        auVar27._8_4_ = iVar1;
        auVar27._12_4_ = iVar1;
        auVar30._4_4_ = iVar13;
        auVar30._0_4_ = iVar13;
        auVar30._8_4_ = iVar13;
        auVar30._12_4_ = iVar13;
        auVar31 = pmulld(auVar30,auVar18);
        auVar33._4_4_ = iVar6;
        auVar33._0_4_ = iVar6;
        auVar33._8_4_ = iVar6;
        auVar33._12_4_ = iVar6;
        auVar34 = pmulld(auVar33,auVar20);
        auVar24 = pmulld(auVar22,auVar15);
        auVar28 = pmulld(auVar27,auVar16);
        auStack_88._4_4_ = auVar28._4_4_ + auVar24._4_4_ + auVar34._4_4_ + auVar31._4_4_;
        auStack_88._0_4_ = auVar28._0_4_ + auVar24._0_4_ + auVar34._0_4_ + auVar31._0_4_;
        e[0] = auVar28._8_4_ + auVar24._8_4_ + auVar34._8_4_ + auVar31._8_4_;
        e[1] = auVar28._12_4_ + auVar24._12_4_ + auVar34._12_4_ + auVar31._12_4_;
        iVar1 = pi2_tmp[0x30] * 0x24 + pi2_tmp[0x10] * 0x53;
        iVar13 = pi2_tmp[0x30] * -0x53 + pi2_tmp[0x10] * 0x24;
        iVar6 = pi2_tmp[0x20] * 0x40 + *pi2_tmp * 0x40;
        iVar7 = pi2_tmp[0x20] * -0x40 + *pi2_tmp * 0x40;
        local_b8[0] = iVar6 + iVar1;
        local_b8[3] = iVar6 - iVar1;
        local_b8[1] = iVar7 + iVar13;
        local_b8[2] = iVar7 - iVar13;
        lVar2 = 0xc;
        lVar14 = 0;
        do {
          iVar6 = local_b8[lVar14] + e[lVar14 + -2] + 0x800 >> 0xc;
          if (iVar6 < -0x7fff) {
            iVar6 = -0x8000;
          }
          if (0x7ffe < iVar6) {
            iVar6 = 0x7fff;
          }
          iVar6 = (uint)pu1_pred[lVar14] + iVar6;
          if (iVar6 < 1) {
            iVar6 = 0;
          }
          if (0xfe < iVar6) {
            iVar6 = 0xff;
          }
          pu1_dst[lVar14] = (UWORD8)iVar6;
          iVar6 = (*(int *)((long)local_b8 + lVar2) - *(int *)(auStack_88 + lVar2)) + 0x800 >> 0xc;
          if (iVar6 < -0x7fff) {
            iVar6 = -0x8000;
          }
          if (0x7ffe < iVar6) {
            iVar6 = 0x7fff;
          }
          iVar6 = (uint)pu1_pred[lVar14 + 4] + iVar6;
          if (iVar6 < 1) {
            iVar6 = 0;
          }
          if (0xfe < iVar6) {
            iVar6 = 0xff;
          }
          pu1_dst[lVar14 + 4] = (UWORD8)iVar6;
          lVar14 = lVar14 + 1;
          lVar2 = lVar2 + -4;
        } while (lVar14 != 4);
        pi2_tmp = pi2_tmp + 1;
        pu1_pred = pu1_pred + pred_strd;
        pu1_dst = pu1_dst + dst_strd;
        iVar11 = iVar11 + 1;
      } while (iVar11 != 8);
    }
  }
  else {
    auVar15 = pmovsxwd(in_XMM0,0x120032004b0059);
    auVar16 = pmovsxwd(in_XMM1,0xffceffa7ffee004b);
    auVar20 = pmovsxwd(in_XMM2,0x4b0012ffa70032);
    auVar18 = pmovsxwd(in_XMM3,0xffa7004bffce0012);
    auVar24 = pmovsxbd(in_XMM4,0x40404040);
    lVar2 = 0;
    do {
      if ((zero_cols & 1U) == 0) {
        iVar10 = (int)*(short *)((long)pi2_src + lVar2 + (long)(src_strd * 7) * 2);
        iVar4 = (int)*(short *)((long)pi2_src + lVar2 + (long)(src_strd * 5) * 2);
        iVar1 = (int)*(short *)((long)pi2_src + lVar2 + (long)(src_strd * 3) * 2);
        iVar7 = (int)*(short *)((long)pi2_src + lVar2 + (long)src_strd * 2);
        iVar5 = (int)*(short *)((long)pi2_src + lVar2 + (long)(src_strd * 2) * 2);
        iVar6 = (int)*(short *)((long)pi2_src + lVar2 + (long)(src_strd * 6) * 2);
        iVar13 = iVar6 * 0x24 + iVar5 * 0x53;
        iVar5 = iVar6 * -0x53 + iVar5 * 0x24;
        iVar6 = (int)*(short *)((long)pi2_src + lVar2 + (long)(src_strd * 4) * 2);
        iVar8 = iVar6 * 0x40 + *(short *)((long)pi2_src + lVar2) * 0x40;
        iVar12 = iVar6 * -0x40 + *(short *)((long)pi2_src + lVar2) * 0x40;
        iVar6 = iVar8 + iVar13;
        iVar8 = iVar8 - iVar13;
        iVar13 = iVar12 + iVar5;
        iVar12 = iVar12 - iVar5;
        auVar37._4_4_ = iVar7;
        auVar37._0_4_ = iVar7;
        auVar37._8_4_ = iVar7;
        auVar37._12_4_ = iVar7;
        auVar31._4_4_ = iVar1;
        auVar31._0_4_ = iVar1;
        auVar31._8_4_ = iVar1;
        auVar31._12_4_ = iVar1;
        auVar36._4_4_ = iVar4;
        auVar36._0_4_ = iVar4;
        auVar36._8_4_ = iVar4;
        auVar36._12_4_ = iVar4;
        auVar28._4_4_ = iVar10;
        auVar28._0_4_ = iVar10;
        auVar28._8_4_ = iVar10;
        auVar28._12_4_ = iVar10;
        auVar38 = pmulld(auVar37,auVar15);
        auVar31 = pmulld(auVar31,auVar16);
        auVar34 = pmulld(auVar36,auVar20);
        auVar28 = pmulld(auVar28,auVar18);
        iVar1 = auVar28._0_4_ + auVar34._0_4_ + auVar31._0_4_ + auVar38._0_4_;
        iVar7 = auVar28._4_4_ + auVar34._4_4_ + auVar31._4_4_ + auVar38._4_4_;
        iVar10 = auVar28._8_4_ + auVar34._8_4_ + auVar31._8_4_ + auVar38._8_4_;
        iVar5 = auVar28._12_4_ + auVar34._12_4_ + auVar31._12_4_ + auVar38._12_4_;
        auVar34._0_4_ = iVar6 + iVar1 + auVar24._0_4_ >> 7;
        auVar34._4_4_ = iVar13 + iVar7 + auVar24._4_4_ >> 7;
        auVar34._8_4_ = iVar12 + iVar10 + auVar24._8_4_ >> 7;
        auVar34._12_4_ = iVar8 + iVar5 + auVar24._12_4_ >> 7;
        auVar28 = packssdw(auVar34,auVar34);
        *(long *)(pi2_tmp + lVar2 * 4) = auVar28._0_8_;
        auVar38._0_4_ = (iVar8 - iVar5) + auVar24._0_4_ >> 7;
        auVar38._4_4_ = (iVar12 - iVar10) + auVar24._4_4_ >> 7;
        auVar38._8_4_ = (iVar13 - iVar7) + auVar24._8_4_ >> 7;
        auVar38._12_4_ = (iVar6 - iVar1) + auVar24._12_4_ >> 7;
        auVar28 = packssdw(auVar38,auVar38);
        *(long *)(pi2_tmp + lVar2 * 4 + 4) = auVar28._0_8_;
      }
      else {
        *(undefined1 (*) [16])(pi2_tmp + lVar2 * 4) = (undefined1  [16])0x0;
      }
      zero_cols = zero_cols >> 1;
      lVar2 = lVar2 + 2;
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
    if (uVar9 == 0xf0) {
      iVar11 = 0;
      do {
        iVar6 = (int)pi2_tmp[0x18];
        iVar13 = (int)pi2_tmp[8];
        auVar20._4_4_ = iVar13;
        auVar20._0_4_ = iVar13;
        auVar20._8_4_ = iVar13;
        auVar20._12_4_ = iVar13;
        auVar18._4_4_ = iVar6;
        auVar18._0_4_ = iVar6;
        auVar18._8_4_ = iVar6;
        auVar18._12_4_ = iVar6;
        auVar20 = pmulld(auVar20,auVar15);
        auVar18 = pmulld(auVar18,auVar16);
        auStack_88._4_4_ = auVar18._4_4_ + auVar20._4_4_;
        auStack_88._0_4_ = auVar18._0_4_ + auVar20._0_4_;
        e[0] = auVar18._8_4_ + auVar20._8_4_;
        e[1] = auVar18._12_4_ + auVar20._12_4_;
        iVar6 = (int)pi2_tmp[0x10];
        iVar1 = *pi2_tmp * 0x40;
        iVar13 = *pi2_tmp * 0x40;
        local_b8[0] = iVar13 + iVar6 * 0x53;
        local_b8[3] = iVar13 + iVar6 * -0x53;
        local_b8[1] = iVar1 + iVar6 * 0x24;
        local_b8[2] = iVar1 + iVar6 * -0x24;
        lVar2 = 0xc;
        lVar14 = 0;
        do {
          iVar6 = local_b8[lVar14] + e[lVar14 + -2] + 0x800 >> 0xc;
          if (iVar6 < -0x7fff) {
            iVar6 = -0x8000;
          }
          if (0x7ffe < iVar6) {
            iVar6 = 0x7fff;
          }
          iVar6 = (uint)pu1_pred[lVar14] + iVar6;
          if (iVar6 < 1) {
            iVar6 = 0;
          }
          if (0xfe < iVar6) {
            iVar6 = 0xff;
          }
          pu1_dst[lVar14] = (UWORD8)iVar6;
          iVar6 = (*(int *)((long)local_b8 + lVar2) - *(int *)(auStack_88 + lVar2)) + 0x800 >> 0xc;
          if (iVar6 < -0x7fff) {
            iVar6 = -0x8000;
          }
          if (0x7ffe < iVar6) {
            iVar6 = 0x7fff;
          }
          iVar6 = (uint)pu1_pred[lVar14 + 4] + iVar6;
          if (iVar6 < 1) {
            iVar6 = 0;
          }
          if (0xfe < iVar6) {
            iVar6 = 0xff;
          }
          pu1_dst[lVar14 + 4] = (UWORD8)iVar6;
          lVar14 = lVar14 + 1;
          lVar2 = lVar2 + -4;
        } while (lVar14 != 4);
        pi2_tmp = pi2_tmp + 1;
        pu1_pred = pu1_pred + pred_strd;
        pu1_dst = pu1_dst + dst_strd;
        iVar11 = iVar11 + 1;
      } while (iVar11 != 8);
    }
    else {
      iVar11 = 0;
      do {
        iVar6 = (int)pi2_tmp[0x38];
        iVar13 = (int)pi2_tmp[0x28];
        iVar1 = (int)pi2_tmp[0x18];
        iVar7 = (int)pi2_tmp[8];
        auVar24._4_4_ = iVar7;
        auVar24._0_4_ = iVar7;
        auVar24._8_4_ = iVar7;
        auVar24._12_4_ = iVar7;
        auVar29._4_4_ = iVar1;
        auVar29._0_4_ = iVar1;
        auVar29._8_4_ = iVar1;
        auVar29._12_4_ = iVar1;
        auVar32._4_4_ = iVar13;
        auVar32._0_4_ = iVar13;
        auVar32._8_4_ = iVar13;
        auVar32._12_4_ = iVar13;
        auVar35._4_4_ = iVar6;
        auVar35._0_4_ = iVar6;
        auVar35._8_4_ = iVar6;
        auVar35._12_4_ = iVar6;
        auVar24 = pmulld(auVar24,auVar15);
        auVar28 = pmulld(auVar29,auVar16);
        auVar31 = pmulld(auVar32,auVar20);
        auVar34 = pmulld(auVar35,auVar18);
        auStack_88._4_4_ = auVar34._4_4_ + auVar31._4_4_ + auVar28._4_4_ + auVar24._4_4_;
        auStack_88._0_4_ = auVar34._0_4_ + auVar31._0_4_ + auVar28._0_4_ + auVar24._0_4_;
        e[0] = auVar34._8_4_ + auVar31._8_4_ + auVar28._8_4_ + auVar24._8_4_;
        e[1] = auVar34._12_4_ + auVar31._12_4_ + auVar28._12_4_ + auVar24._12_4_;
        iVar13 = pi2_tmp[0x30] * 0x24 + pi2_tmp[0x10] * 0x53;
        iVar6 = pi2_tmp[0x30] * -0x53 + pi2_tmp[0x10] * 0x24;
        iVar7 = pi2_tmp[0x20] * 0x40 + *pi2_tmp * 0x40;
        iVar1 = pi2_tmp[0x20] * -0x40 + *pi2_tmp * 0x40;
        local_b8[0] = iVar7 + iVar13;
        local_b8[3] = iVar7 - iVar13;
        local_b8[1] = iVar1 + iVar6;
        local_b8[2] = iVar1 - iVar6;
        lVar2 = 0xc;
        lVar14 = 0;
        do {
          iVar6 = local_b8[lVar14] + e[lVar14 + -2] + 0x800 >> 0xc;
          if (iVar6 < -0x7fff) {
            iVar6 = -0x8000;
          }
          if (0x7ffe < iVar6) {
            iVar6 = 0x7fff;
          }
          iVar6 = (uint)pu1_pred[lVar14] + iVar6;
          if (iVar6 < 1) {
            iVar6 = 0;
          }
          if (0xfe < iVar6) {
            iVar6 = 0xff;
          }
          pu1_dst[lVar14] = (UWORD8)iVar6;
          iVar6 = (*(int *)((long)local_b8 + lVar2) - *(int *)(auStack_88 + lVar2)) + 0x800 >> 0xc;
          if (iVar6 < -0x7fff) {
            iVar6 = -0x8000;
          }
          if (0x7ffe < iVar6) {
            iVar6 = 0x7fff;
          }
          iVar6 = (uint)pu1_pred[lVar14 + 4] + iVar6;
          if (iVar6 < 1) {
            iVar6 = 0;
          }
          if (0xfe < iVar6) {
            iVar6 = 0xff;
          }
          pu1_dst[lVar14 + 4] = (UWORD8)iVar6;
          lVar14 = lVar14 + 1;
          lVar2 = lVar2 + -4;
        } while (lVar14 != 4);
        pi2_tmp = pi2_tmp + 1;
        pu1_pred = pu1_pred + pred_strd;
        pu1_dst = pu1_dst + dst_strd;
        iVar11 = iVar11 + 1;
      } while (iVar11 != 8);
    }
  }
  return;
}

Assistant:

void ihevc_itrans_recon_8x8(WORD16 *pi2_src,
                            WORD16 *pi2_tmp,
                            UWORD8 *pu1_pred,
                            UWORD8 *pu1_dst,
                            WORD32 src_strd,
                            WORD32 pred_strd,
                            WORD32 dst_strd,
                            WORD32 zero_cols,
                            WORD32 zero_rows)
{
    WORD32 j, k;
    WORD32 e[4], o[4];
    WORD32 ee[2], eo[2];
    WORD32 add;
    WORD32 shift;
    WORD16 *pi2_tmp_orig;
    WORD32 trans_size;
    WORD32 zero_rows_2nd_stage = zero_cols;
    WORD32 row_limit_2nd_stage;

    trans_size = TRANS_SIZE_8;

    pi2_tmp_orig = pi2_tmp;

    if((zero_cols & 0xF0) == 0xF0)
        row_limit_2nd_stage = 4;
    else
        row_limit_2nd_stage = TRANS_SIZE_8;


    if((zero_rows & 0xF0) == 0xF0) /* First 4 rows of input are non-zero */
    {
        /************************************************************************************************/
        /**********************************START - IT_RECON_8x8******************************************/
        /************************************************************************************************/

        /* Inverse Transform 1st stage */
        shift = IT_SHIFT_STAGE_1;
        add = 1 << (shift - 1);

        for(j = 0; j < row_limit_2nd_stage; j++)
        {
            /* Checking for Zero Cols */
            if((zero_cols & 1) == 1)
            {
                memset(pi2_tmp, 0, trans_size * sizeof(WORD16));
            }
            else
            {
                /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
                for(k = 0; k < 4; k++)
                {
                    o[k] = g_ai2_ihevc_trans_8[1][k] * pi2_src[src_strd]
                                    + g_ai2_ihevc_trans_8[3][k]
                                                    * pi2_src[3 * src_strd];
                }
                eo[0] = g_ai2_ihevc_trans_8[2][0] * pi2_src[2 * src_strd];
                eo[1] = g_ai2_ihevc_trans_8[2][1] * pi2_src[2 * src_strd];
                ee[0] = g_ai2_ihevc_trans_8[0][0] * pi2_src[0];
                ee[1] = g_ai2_ihevc_trans_8[0][1] * pi2_src[0];

                /* Combining e and o terms at each hierarchy levels to calculate the final spatial domain vector */
                e[0] = ee[0] + eo[0];
                e[3] = ee[0] - eo[0];
                e[1] = ee[1] + eo[1];
                e[2] = ee[1] - eo[1];
                for(k = 0; k < 4; k++)
                {
                    pi2_tmp[k] =
                                    CLIP_S16(((e[k] + o[k] + add) >> shift));
                    pi2_tmp[k + 4] =
                                    CLIP_S16(((e[3 - k] - o[3 - k] + add) >> shift));
                }
            }
            pi2_src++;
            pi2_tmp += trans_size;
            zero_cols = zero_cols >> 1;
        }

        pi2_tmp = pi2_tmp_orig;

        /* Inverse Transform 2nd stage */
        shift = IT_SHIFT_STAGE_2;
        add = 1 << (shift - 1);
        if((zero_rows_2nd_stage & 0xF0) == 0xF0) /* First 4 rows of output of 1st stage are non-zero */
        {
            for(j = 0; j < trans_size; j++)
            {
                /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
                for(k = 0; k < 4; k++)
                {
                    o[k] = g_ai2_ihevc_trans_8[1][k] * pi2_tmp[trans_size]
                                    + g_ai2_ihevc_trans_8[3][k] * pi2_tmp[3 * trans_size];
                }
                eo[0] = g_ai2_ihevc_trans_8[2][0] * pi2_tmp[2 * trans_size];
                eo[1] = g_ai2_ihevc_trans_8[2][1] * pi2_tmp[2 * trans_size];
                ee[0] = g_ai2_ihevc_trans_8[0][0] * pi2_tmp[0];
                ee[1] = g_ai2_ihevc_trans_8[0][1] * pi2_tmp[0];

                /* Combining e and o terms at each hierarchy levels to calculate the final spatial domain vector */
                e[0] = ee[0] + eo[0];
                e[3] = ee[0] - eo[0];
                e[1] = ee[1] + eo[1];
                e[2] = ee[1] - eo[1];
                for(k = 0; k < 4; k++)
                {
                    WORD32 itrans_out;
                    itrans_out =
                                    CLIP_S16(((e[k] + o[k] + add) >> shift));
                    pu1_dst[k] = CLIP_U8((itrans_out + pu1_pred[k]));
                    itrans_out =
                                    CLIP_S16(((e[3 - k] - o[3 - k] + add) >> shift));
                    pu1_dst[k + 4] = CLIP_U8((itrans_out + pu1_pred[k + 4]));
                }
                pi2_tmp++;
                pu1_pred += pred_strd;
                pu1_dst += dst_strd;
            }
        }
        else /* All rows of output of 1st stage are non-zero */
        {
            for(j = 0; j < trans_size; j++)
            {
                /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
                for(k = 0; k < 4; k++)
                {
                    o[k] = g_ai2_ihevc_trans_8[1][k] * pi2_tmp[trans_size]
                                    + g_ai2_ihevc_trans_8[3][k]
                                                    * pi2_tmp[3 * trans_size]
                                    + g_ai2_ihevc_trans_8[5][k]
                                                    * pi2_tmp[5 * trans_size]
                                    + g_ai2_ihevc_trans_8[7][k]
                                                    * pi2_tmp[7 * trans_size];
                }

                eo[0] = g_ai2_ihevc_trans_8[2][0] * pi2_tmp[2 * trans_size]
                                + g_ai2_ihevc_trans_8[6][0] * pi2_tmp[6 * trans_size];
                eo[1] = g_ai2_ihevc_trans_8[2][1] * pi2_tmp[2 * trans_size]
                                + g_ai2_ihevc_trans_8[6][1] * pi2_tmp[6 * trans_size];
                ee[0] = g_ai2_ihevc_trans_8[0][0] * pi2_tmp[0]
                                + g_ai2_ihevc_trans_8[4][0] * pi2_tmp[4 * trans_size];
                ee[1] = g_ai2_ihevc_trans_8[0][1] * pi2_tmp[0]
                                + g_ai2_ihevc_trans_8[4][1] * pi2_tmp[4 * trans_size];

                /* Combining e and o terms at each hierarchy levels to calculate the final spatial domain vector */
                e[0] = ee[0] + eo[0];
                e[3] = ee[0] - eo[0];
                e[1] = ee[1] + eo[1];
                e[2] = ee[1] - eo[1];
                for(k = 0; k < 4; k++)
                {
                    WORD32 itrans_out;
                    itrans_out =
                                    CLIP_S16(((e[k] + o[k] + add) >> shift));
                    pu1_dst[k] = CLIP_U8((itrans_out + pu1_pred[k]));
                    itrans_out =
                                    CLIP_S16(((e[3 - k] - o[3 - k] + add) >> shift));
                    pu1_dst[k + 4] = CLIP_U8((itrans_out + pu1_pred[k + 4]));
                }
                pi2_tmp++;
                pu1_pred += pred_strd;
                pu1_dst += dst_strd;
            }
        }
        /************************************************************************************************/
        /************************************END - IT_RECON_8x8******************************************/
        /************************************************************************************************/
    }
    else /* All rows of input are non-zero */
    {
        /************************************************************************************************/
        /**********************************START - IT_RECON_8x8******************************************/
        /************************************************************************************************/

        /* Inverse Transform 1st stage */
        shift = IT_SHIFT_STAGE_1;
        add = 1 << (shift - 1);

        for(j = 0; j < row_limit_2nd_stage; j++)
        {
            /* Checking for Zero Cols */
            if((zero_cols & 1) == 1)
            {
                memset(pi2_tmp, 0, trans_size * sizeof(WORD16));
            }
            else
            {
                /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
                for(k = 0; k < 4; k++)
                {
                    o[k] = g_ai2_ihevc_trans_8[1][k] * pi2_src[src_strd]
                                    + g_ai2_ihevc_trans_8[3][k]
                                                    * pi2_src[3 * src_strd]
                                    + g_ai2_ihevc_trans_8[5][k]
                                                    * pi2_src[5 * src_strd]
                                    + g_ai2_ihevc_trans_8[7][k]
                                                    * pi2_src[7 * src_strd];
                }

                eo[0] = g_ai2_ihevc_trans_8[2][0] * pi2_src[2 * src_strd]
                                + g_ai2_ihevc_trans_8[6][0] * pi2_src[6 * src_strd];
                eo[1] = g_ai2_ihevc_trans_8[2][1] * pi2_src[2 * src_strd]
                                + g_ai2_ihevc_trans_8[6][1] * pi2_src[6 * src_strd];
                ee[0] = g_ai2_ihevc_trans_8[0][0] * pi2_src[0]
                                + g_ai2_ihevc_trans_8[4][0] * pi2_src[4 * src_strd];
                ee[1] = g_ai2_ihevc_trans_8[0][1] * pi2_src[0]
                                + g_ai2_ihevc_trans_8[4][1] * pi2_src[4 * src_strd];

                /* Combining e and o terms at each hierarchy levels to calculate the final spatial domain vector */
                e[0] = ee[0] + eo[0];
                e[3] = ee[0] - eo[0];
                e[1] = ee[1] + eo[1];
                e[2] = ee[1] - eo[1];
                for(k = 0; k < 4; k++)
                {
                    pi2_tmp[k] =
                                    CLIP_S16(((e[k] + o[k] + add) >> shift));
                    pi2_tmp[k + 4] =
                                    CLIP_S16(((e[3 - k] - o[3 - k] + add) >> shift));
                }
            }
            pi2_src++;
            pi2_tmp += trans_size;
            zero_cols = zero_cols >> 1;
        }

        pi2_tmp = pi2_tmp_orig;

        /* Inverse Transform 2nd stage */
        shift = IT_SHIFT_STAGE_2;
        add = 1 << (shift - 1);
        if((zero_rows_2nd_stage & 0xF0) == 0xF0) /* First 4 rows of output of 1st stage are non-zero */
        {
            for(j = 0; j < trans_size; j++)
            {
                /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
                for(k = 0; k < 4; k++)
                {
                    o[k] = g_ai2_ihevc_trans_8[1][k] * pi2_tmp[trans_size]
                                    + g_ai2_ihevc_trans_8[3][k] * pi2_tmp[3 * trans_size];
                }
                eo[0] = g_ai2_ihevc_trans_8[2][0] * pi2_tmp[2 * trans_size];
                eo[1] = g_ai2_ihevc_trans_8[2][1] * pi2_tmp[2 * trans_size];
                ee[0] = g_ai2_ihevc_trans_8[0][0] * pi2_tmp[0];
                ee[1] = g_ai2_ihevc_trans_8[0][1] * pi2_tmp[0];

                /* Combining e and o terms at each hierarchy levels to calculate the final spatial domain vector */
                e[0] = ee[0] + eo[0];
                e[3] = ee[0] - eo[0];
                e[1] = ee[1] + eo[1];
                e[2] = ee[1] - eo[1];
                for(k = 0; k < 4; k++)
                {
                    WORD32 itrans_out;
                    itrans_out =
                                    CLIP_S16(((e[k] + o[k] + add) >> shift));
                    pu1_dst[k] = CLIP_U8((itrans_out + pu1_pred[k]));
                    itrans_out =
                                    CLIP_S16(((e[3 - k] - o[3 - k] + add) >> shift));
                    pu1_dst[k + 4] = CLIP_U8((itrans_out + pu1_pred[k + 4]));
                }
                pi2_tmp++;
                pu1_pred += pred_strd;
                pu1_dst += dst_strd;
            }
        }
        else /* All rows of output of 1st stage are non-zero */
        {
            for(j = 0; j < trans_size; j++)
            {
                /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
                for(k = 0; k < 4; k++)
                {
                    o[k] = g_ai2_ihevc_trans_8[1][k] * pi2_tmp[trans_size]
                                    + g_ai2_ihevc_trans_8[3][k]
                                                    * pi2_tmp[3 * trans_size]
                                    + g_ai2_ihevc_trans_8[5][k]
                                                    * pi2_tmp[5 * trans_size]
                                    + g_ai2_ihevc_trans_8[7][k]
                                                    * pi2_tmp[7 * trans_size];
                }

                eo[0] = g_ai2_ihevc_trans_8[2][0] * pi2_tmp[2 * trans_size]
                                + g_ai2_ihevc_trans_8[6][0] * pi2_tmp[6 * trans_size];
                eo[1] = g_ai2_ihevc_trans_8[2][1] * pi2_tmp[2 * trans_size]
                                + g_ai2_ihevc_trans_8[6][1] * pi2_tmp[6 * trans_size];
                ee[0] = g_ai2_ihevc_trans_8[0][0] * pi2_tmp[0]
                                + g_ai2_ihevc_trans_8[4][0] * pi2_tmp[4 * trans_size];
                ee[1] = g_ai2_ihevc_trans_8[0][1] * pi2_tmp[0]
                                + g_ai2_ihevc_trans_8[4][1] * pi2_tmp[4 * trans_size];

                /* Combining e and o terms at each hierarchy levels to calculate the final spatial domain vector */
                e[0] = ee[0] + eo[0];
                e[3] = ee[0] - eo[0];
                e[1] = ee[1] + eo[1];
                e[2] = ee[1] - eo[1];
                for(k = 0; k < 4; k++)
                {
                    WORD32 itrans_out;
                    itrans_out =
                                    CLIP_S16(((e[k] + o[k] + add) >> shift));
                    pu1_dst[k] = CLIP_U8((itrans_out + pu1_pred[k]));
                    itrans_out =
                                    CLIP_S16(((e[3 - k] - o[3 - k] + add) >> shift));
                    pu1_dst[k + 4] = CLIP_U8((itrans_out + pu1_pred[k + 4]));
                }
                pi2_tmp++;
                pu1_pred += pred_strd;
                pu1_dst += dst_strd;
            }
        }
        /************************************************************************************************/
        /************************************END - IT_RECON_8x8******************************************/
        /************************************************************************************************/
    }
}